

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_sprk.c
# Opt level: O3

ARKodeSPRKTable ARKodeSPRKTable_Alloc(int stages)

{
  ARKodeSPRKTable sprk_table;
  sunrealtype *psVar1;
  
  sprk_table = (ARKodeSPRKTable)calloc(1,0x18);
  if (sprk_table != (ARKodeSPRKTable)0x0) {
    psVar1 = (sunrealtype *)malloc((long)stages << 3);
    sprk_table->ahat = psVar1;
    if (psVar1 != (sunrealtype *)0x0) {
      psVar1 = (sunrealtype *)malloc((long)stages << 3);
      sprk_table->a = psVar1;
      if (psVar1 != (sunrealtype *)0x0) {
        sprk_table->stages = stages;
        return sprk_table;
      }
    }
    ARKodeSPRKTable_Free(sprk_table);
  }
  return (ARKodeSPRKTable)0x0;
}

Assistant:

ARKodeSPRKTable ARKodeSPRKTable_Alloc(int stages)
{
  ARKodeSPRKTable sprk_table = NULL;

  sprk_table = (ARKodeSPRKTable)malloc(sizeof(struct ARKodeSPRKTableMem));
  if (!sprk_table) { return NULL; }

  memset(sprk_table, 0, sizeof(struct ARKodeSPRKTableMem));

  sprk_table->ahat = (sunrealtype*)malloc(stages * sizeof(sunrealtype));
  if (!(sprk_table->ahat))
  {
    ARKodeSPRKTable_Free(sprk_table);
    return NULL;
  }

  sprk_table->a = (sunrealtype*)malloc(stages * sizeof(sunrealtype));
  if (!(sprk_table->a))
  {
    ARKodeSPRKTable_Free(sprk_table);
    return NULL;
  }

  sprk_table->stages = stages;

  return sprk_table;
}